

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

void Gia_ManTerAnalyze2(Vec_Ptr_t *vStates,int nRegs)

{
  uint *puVar1;
  undefined4 uVar2;
  void *__s;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  void **ppvVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  if (vStates->nSize < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
  }
  uVar6 = vStates->nSize - 1;
  vStates->nSize = uVar6;
  __s = vStates->pArray[uVar6];
  uVar6 = ((nRegs >> 4) + 1) - (uint)((nRegs & 0xfU) == 0);
  memset(__s,0,(long)(int)uVar6 << 2);
  iVar13 = vStates->nSize;
  if (0 < iVar13) {
    ppvVar7 = vStates->pArray;
    lVar9 = 0;
    do {
      if (0 < (int)uVar6) {
        pvVar3 = ppvVar7[lVar9];
        uVar10 = 0;
        do {
          puVar1 = (uint *)((long)__s + uVar10 * 4);
          *puVar1 = *puVar1 | *(uint *)((long)pvVar3 + uVar10 * 4);
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
        iVar13 = vStates->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar13);
  }
  if (0 < nRegs) {
    uVar11 = 0;
    uVar12 = 1;
    iVar13 = 2;
    iVar15 = 3;
    uVar10 = 0;
    auVar24 = (undefined1  [16])0x0;
    do {
      bVar4 = (int)(nRegs - 1U ^ 0x80000000) < (int)(uVar11 ^ 0x80000000);
      bVar5 = (int)(uVar12 ^ 0x80000000) <= (int)(nRegs - 1U ^ 0x80000000);
      auVar18 = auVar24;
      if ((bool)(~bVar4 & 1)) {
        auVar18 = ZEXT416(*(uint *)((long)__s + (uVar10 >> 4) * 4));
      }
      if (bVar5) {
        in_XMM12._0_8_ = CONCAT44(*(undefined4 *)((long)__s + (uVar10 >> 4) * 4),auVar18._0_4_);
        in_XMM12._8_4_ = auVar18._8_4_;
        in_XMM12._12_4_ = auVar18._12_4_;
        auVar18._0_8_ = in_XMM12._0_8_;
      }
      if (!bVar4) {
        uVar2 = *(undefined4 *)((long)__s + (uVar10 >> 4) * 4);
        in_XMM12._4_4_ = uVar2;
        in_XMM12._0_4_ = uVar2;
        in_XMM12._8_4_ = auVar18._12_4_;
        in_XMM12._12_4_ = auVar18._0_4_;
        auVar18._8_4_ = uVar2;
      }
      if (bVar5) {
        auVar18._12_4_ = *(undefined4 *)((long)__s + (uVar10 >> 4) * 4);
      }
      auVar19._4_4_ = uVar12 * 2;
      auVar19._0_4_ = uVar11 * 2;
      auVar19._8_4_ = iVar13 * 2;
      auVar19._12_4_ = iVar15 * 2;
      auVar19 = auVar19 & _DAT_0085f0f0;
      auVar22 = pshuflw(in_XMM12,auVar19,0xfe);
      auVar23 = pshuflw(auVar22,auVar19,0x54);
      auVar20._8_4_ = auVar19._8_4_;
      auVar20._12_4_ = auVar19._12_4_;
      auVar20._0_8_ = auVar19._8_8_;
      in_XMM12 = pshuflw(auVar23,auVar20,0xfe);
      auVar19 = pshuflw(auVar20,auVar20,0x54);
      auVar23._0_4_ = auVar24._0_4_ + (uint)((auVar18._0_4_ >> auVar23._0_8_ & 3) == 1);
      auVar23._4_4_ = auVar24._4_4_ + (uint)((auVar18._4_4_ >> auVar22._0_8_ & 3) == 1);
      auVar23._8_4_ = auVar24._8_4_ + (uint)((auVar18._8_4_ >> auVar19._0_8_ & 3) == 1);
      auVar23._12_4_ = auVar24._12_4_ + (uint)((auVar18._12_4_ >> in_XMM12._0_8_ & 3) == 1);
      uVar8 = (int)uVar10 + 4;
      uVar10 = (ulong)uVar8;
      uVar11 = uVar11 + 4;
      uVar12 = uVar12 + 4;
      iVar13 = iVar13 + 4;
      iVar15 = iVar15 + 4;
      auVar24 = auVar23;
    } while ((nRegs + 3U & 0xfffffffc) != uVar8);
  }
  printf("Found %d constant registers.\n");
  memset(__s,0,(long)(int)uVar6 << 2);
  iVar13 = vStates->nSize;
  if (0 < iVar13) {
    ppvVar7 = vStates->pArray;
    lVar9 = 0;
    do {
      if (0 < (int)uVar6) {
        pvVar3 = ppvVar7[lVar9];
        uVar10 = 0;
        do {
          uVar11 = *(uint *)((long)pvVar3 + uVar10 * 4);
          puVar1 = (uint *)((long)__s + uVar10 * 4);
          *puVar1 = *puVar1 | ~(uVar11 >> 1 ^ uVar11) & 0x55555555;
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
        iVar13 = vStates->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar13);
  }
  uVar10 = 0;
  if (0 < nRegs) {
    uVar11 = nRegs - 1;
    uVar12 = 0;
    uVar8 = 1;
    uVar14 = 2;
    uVar16 = 3;
    uVar6 = 0;
    auVar22._8_4_ = 0xffffffff;
    auVar22._0_8_ = 0xffffffffffffffff;
    auVar22._12_4_ = 0xffffffff;
    auVar24 = (undefined1  [16])0x0;
    do {
      auVar18 = auVar24;
      auVar17._0_4_ = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(uVar12 ^ 0x80000000));
      auVar17._4_4_ = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(uVar8 ^ 0x80000000));
      auVar17._8_4_ = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(uVar14 ^ 0x80000000));
      auVar17._12_4_ = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(uVar16 ^ 0x80000000));
      auVar21 = auVar18;
      if ((~auVar17._0_4_ & 1) != 0) {
        auVar21 = ZEXT416(*(uint *)((long)__s + (ulong)(uVar6 >> 4) * 4));
      }
      auVar24 = auVar17 ^ auVar22;
      if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar21._4_4_ = *(undefined4 *)((long)__s + (ulong)(uVar6 >> 4) * 4);
      }
      if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar21._8_4_ = *(undefined4 *)((long)__s + (ulong)(uVar6 >> 4) * 4);
      }
      if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar21._12_4_ = *(undefined4 *)((long)__s + (ulong)(uVar6 >> 4) * 4);
      }
      auVar25._0_4_ = (int)(float)((uVar12 & 0xf) * 0x1000000 + 0x3f800000);
      auVar25._4_4_ = (int)(float)((uVar8 & 0xf) * 0x1000000 + 0x3f800000);
      auVar25._8_4_ = (int)(float)((uVar14 & 0xf) * 0x1000000 + 0x3f800000);
      auVar25._12_4_ = (int)(float)((uVar16 & 0xf) * 0x1000000 + 0x3f800000);
      auVar27._0_4_ = auVar25._0_4_ * 3;
      auVar26._8_4_ = (undefined4)((auVar25._8_8_ & 0xffffffff) * 3);
      auVar26._4_4_ = auVar26._8_4_;
      auVar26._0_4_ = auVar27._0_4_;
      auVar26._12_4_ = auVar25._12_4_ * 3;
      auVar27._8_8_ = auVar26._8_8_;
      auVar27._4_4_ = auVar25._4_4_ * 3;
      auVar27 = auVar27 & auVar21;
      auVar24._0_4_ = auVar18._0_4_ + (uint)(auVar27._0_4_ == 0);
      auVar24._4_4_ = auVar18._4_4_ + (uint)(auVar27._4_4_ == 0);
      auVar24._8_4_ = auVar18._8_4_ + (uint)(auVar27._8_4_ == 0);
      auVar24._12_4_ = auVar18._12_4_ + (uint)(auVar27._12_4_ == 0);
      uVar6 = uVar6 + 4;
      uVar12 = uVar12 + 4;
      uVar8 = uVar8 + 4;
      uVar14 = uVar14 + 4;
      uVar16 = uVar16 + 4;
    } while ((nRegs + 3U & 0xfffffffc) != uVar6);
    auVar24 = ~auVar17 & auVar24 | auVar18 & auVar17;
    uVar10 = (ulong)(uint)(auVar24._12_4_ + auVar24._4_4_ + auVar24._8_4_ + auVar24._0_4_);
  }
  printf("Found %d non-ternary registers.\n",uVar10);
  uVar6 = vStates->nSize;
  if (uVar6 == vStates->nCap) {
    if ((int)uVar6 < 0x10) {
      if (vStates->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x80);
      }
      else {
        ppvVar7 = (void **)realloc(vStates->pArray,0x80);
      }
      vStates->pArray = ppvVar7;
      vStates->nCap = 0x10;
    }
    else {
      if (vStates->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar7 = (void **)realloc(vStates->pArray,(ulong)uVar6 << 4);
      }
      vStates->pArray = ppvVar7;
      vStates->nCap = uVar6 * 2;
    }
  }
  else {
    ppvVar7 = vStates->pArray;
  }
  iVar13 = vStates->nSize;
  vStates->nSize = iVar13 + 1;
  ppvVar7[iVar13] = __s;
  return;
}

Assistant:

void Gia_ManTerAnalyze2( Vec_Ptr_t * vStates, int nRegs )
{
    unsigned * pTemp, * pStates = (unsigned *)Vec_PtrPop( vStates );
    int i, w, nZeros, nConsts, nStateWords;
    // detect constant zero registers
    nStateWords = Abc_BitWordNum( 2*nRegs );
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= pTemp[w];
    // count the number of zeros
    nZeros = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == GIA_ZER )
            nZeros++;
    printf( "Found %d constant registers.\n", nZeros );
    // detect non-ternary registers
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= (~(pTemp[w] ^ (pTemp[w] >> 1)) & 0x55555555);
    // count the nonternary registers
    nConsts = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == 0 )
            nConsts++;
    printf( "Found %d non-ternary registers.\n", nConsts );
    // return the state back
    Vec_PtrPush( vStates, pStates );
}